

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* testing::GetReservedOutputAttributesForElement
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *xml_element)

{
  bool bVar1;
  ostream *poVar2;
  GTestLog local_1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *xml_element_local;
  
  local_18 = xml_element;
  xml_element_local = (string *)__return_storage_ptr__;
  bVar1 = std::operator==(xml_element,"testsuites");
  if (bVar1) {
    ArrayAsVector<8>(__return_storage_ptr__,(char *(*) [8])kReservedTestSuitesAttributes);
  }
  else {
    bVar1 = std::operator==(local_18,"testsuite");
    if (bVar1) {
      ArrayAsVector<7>(__return_storage_ptr__,(char *(*) [7])kReservedTestSuiteAttributes);
    }
    else {
      bVar1 = std::operator==(local_18,"testcase");
      if (bVar1) {
        ArrayAsVector<10>(__return_storage_ptr__,(char *(*) [10])kReservedOutputTestCaseAttributes);
      }
      else {
        bVar1 = internal::IsTrue(false);
        if (!bVar1) {
          internal::GTestLog::GTestLog
                    (&local_1c,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/gtest/googletest/src/gtest.cc"
                     ,0x85d);
          poVar2 = internal::GTestLog::GetStream(&local_1c);
          poVar2 = std::operator<<(poVar2,"Condition false failed. ");
          poVar2 = std::operator<<(poVar2,"Unrecognized xml_element provided: ");
          std::operator<<(poVar2,(string *)local_18);
          internal::GTestLog::~GTestLog(&local_1c);
        }
        memset(__return_storage_ptr__,0,0x18);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::string> GetReservedOutputAttributesForElement(
    const std::string& xml_element) {
  if (xml_element == "testsuites") {
    return ArrayAsVector(kReservedTestSuitesAttributes);
  } else if (xml_element == "testsuite") {
    return ArrayAsVector(kReservedTestSuiteAttributes);
  } else if (xml_element == "testcase") {
    return ArrayAsVector(kReservedOutputTestCaseAttributes);
  } else {
    GTEST_CHECK_(false) << "Unrecognized xml_element provided: " << xml_element;
  }
  // This code is unreachable but some compilers may not realizes that.
  return std::vector<std::string>();
}